

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::clearBufferfv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,float *value)

{
  bool bVar1;
  int x;
  int z;
  byte bVar2;
  int y;
  int z_00;
  int s;
  int y_00;
  byte bVar3;
  IVec4 area;
  MultisamplePixelBufferAccess access;
  MultisamplePixelBufferAccess colorBuf;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  Vec4 local_c8;
  Vector<int,_4> local_b8;
  BVec4 *local_a8;
  MultisampleConstPixelBufferAccess local_a0;
  MultisamplePixelBufferAccess local_78;
  tcu local_50 [8];
  float afStack_48 [6];
  
  if (buffer - 0x1802 < 0xfffffffe) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (drawbuffer != 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if (this->m_scissorEnabled == true) {
    tcu::Vector<int,_4>::Vector(&local_b8,&this->m_scissorBox);
  }
  else {
    local_b8.m_data[0] = 0;
    local_b8.m_data[1] = 0;
    local_b8.m_data[2] = 0x7fffffff;
    local_b8.m_data[3] = 0x7fffffff;
  }
  if (buffer != 0x1800) {
    getDrawDepthbuffer(&local_78,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_a0,&local_78);
    local_c8.m_data[0] = 0.0;
    local_c8.m_data[1] = 0.0;
    intersect(&local_b8,(IVec4 *)&local_c8);
    if (local_cc == 0 || local_d0 == 0) {
      return;
    }
    if (this->m_depthMask != true) {
      return;
    }
    rr::getSubregion((MultisamplePixelBufferAccess *)&local_a0,&local_78,local_d8,local_d4,local_d0,
                     local_cc);
    rr::clearDepth((MultisamplePixelBufferAccess *)&local_a0,*value);
    return;
  }
  getDrawColorbuffer(&local_78,this);
  bVar1 = (this->m_colorMask).m_data[1];
  if ((this->m_colorMask).m_data[0] == true) {
    bVar2 = 1;
    if ((bVar1 != false) && ((this->m_colorMask).m_data[2] == true)) {
      bVar2 = (this->m_colorMask).m_data[3] ^ 1;
    }
  }
  else {
    bVar2 = 1;
    if ((bVar1 == false) && ((this->m_colorMask).m_data[2] == false)) {
      bVar3 = (this->m_colorMask).m_data[3] ^ 1;
      goto LAB_0048a336;
    }
  }
  bVar3 = 0;
LAB_0048a336:
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_a0,&local_78);
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  intersect(&local_b8,(IVec4 *)&local_c8);
  if (((local_d0 != 0) && (local_cc != 0)) && (bVar3 == 0)) {
    rr::getSubregion((MultisamplePixelBufferAccess *)&local_a0,&local_78,local_d8,local_d4,local_d0,
                     local_cc);
    local_c8.m_data._0_8_ = *(undefined8 *)value;
    local_c8.m_data._8_8_ = *(undefined8 *)(value + 2);
    if ((this->m_sRGBUpdateEnabled == true) &&
       (bVar1 = tcu::isSRGB(local_a0.m_access.m_format), bVar1)) {
      tcu::linearToSRGB(local_50,&local_c8);
      local_c8.m_data._0_8_ = local_50;
      local_c8.m_data[2] = afStack_48[0];
      local_c8.m_data[3] = afStack_48[1];
    }
    if (bVar2 == 0) {
      rr::clear((MultisamplePixelBufferAccess *)&local_a0,&local_c8);
    }
    else {
      local_a8 = &this->m_colorMask;
      for (z_00 = 0; z_00 < local_a0.m_access.m_size.m_data[2]; z_00 = z_00 + 1) {
        for (z = 0; z < local_a0.m_access.m_size.m_data[1]; z = z + 1) {
          for (y_00 = 0; y_00 < local_a0.m_access.m_size.m_data[0]; y_00 = y_00 + 1) {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)(afStack_48 + 2),(int)&local_a0,y_00,z);
            tcu::select<float,4>(local_50,&local_c8,(Vector<float,_4> *)(afStack_48 + 2),local_a8);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&local_a0,(Vec4 *)local_50,y_00,z,z_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferfv (deUint32 buffer, int drawbuffer, const float* value)
{
	RC_IF_ERROR(buffer != GL_COLOR && buffer != GL_DEPTH, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	if (buffer == GL_COLOR)
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			Vec4								color		(value[0], value[1], value[2], value[3]);

			if (m_sRGBUpdateEnabled && tcu::isSRGB(access.raw().getFormat()))
				color = tcu::linearToSRGB(color);

			if (!maskUsed)
				rr::clear(access, color);
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixel(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
	else
	{
		TCU_CHECK_INTERNAL(buffer == GL_DEPTH);

		rr::MultisamplePixelBufferAccess	depthBuf	= getDrawDepthbuffer();
		IVec4								area		= intersect(baseArea, getBufferRect(depthBuf));

		if (!isEmpty(area) && m_depthMask)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(depthBuf, area.x(), area.y(), area.z(), area.w());
			float								depth		= value[0];

			rr::clearDepth(access, depth);
		}
	}
}